

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::constant_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,
          bool inside_block_like_struct_scope,bool inside_struct_scope)

{
  SPIRConstantOp *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRUndef *pSVar5;
  SPIRConstantOp *pSVar6;
  size_t sVar7;
  char (*ts_1) [6];
  char (*ts_1_00) [4];
  char *pcVar8;
  char (*in_R9) [2];
  byte local_749;
  diligent_spirv_cross local_728 [32];
  string local_708;
  undefined1 local_6e8 [8];
  SPIRType tmp_type_2;
  string local_578 [36];
  uint local_554;
  undefined1 local_550 [4];
  uint32_t col;
  undefined1 local_529;
  diligent_spirv_cross local_528 [32];
  string local_508;
  undefined1 local_4e8 [8];
  SPIRType tmp_type_1;
  diligent_spirv_cross local_390 [39];
  allocator local_369;
  diligent_spirv_cross local_368 [39];
  allocator local_341;
  string local_340;
  uint32_t local_31c;
  string local_318 [32];
  SPIRConstant *local_2f8;
  SPIRConstant *subc;
  string local_2d0 [32];
  SPIRConstantOp *local_2b0;
  SPIRConstantOp *op;
  TypedID<(diligent_spirv_cross::Types)3> *elem;
  TypedID<(diligent_spirv_cross::Types)3> *__end4;
  TypedID<(diligent_spirv_cross::Types)3> *__begin4;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>,_8UL> *__range4;
  undefined1 local_280 [4];
  uint32_t subconstant_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [8];
  SPIRType tmp_type;
  SPIRType *p_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_67;
  byte local_66;
  undefined1 local_65;
  bool needs_trailing_tracket;
  bool array_type_decays;
  allocator local_51;
  string local_50;
  SPIRType *local_30;
  SPIRType *type;
  bool inside_struct_scope_local;
  SPIRConstant *pSStack_20;
  bool inside_block_like_struct_scope_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  type._6_1_ = inside_struct_scope;
  type._7_1_ = inside_block_like_struct_scope;
  pSStack_20 = c;
  c_local = (SPIRConstant *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).field_0xc);
  local_30 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  bVar2 = Compiler::is_pointer(&this->super_Compiler,local_30);
  if (bVar2) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->backend).null_pointer_literal);
  }
  else if (((pSStack_20->is_null_array_specialized_length & 1U) == 0) ||
          (((this->backend).requires_matching_array_initializer & 1U) == 0)) {
    bVar2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>::empty
                      (&(pSStack_20->subconstants).
                        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>
                      );
    if (bVar2) {
      if ((local_30->basetype == Struct) &&
         (sVar7 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                            (&(local_30->member_types).
                              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                            ), sVar7 == 0)) {
        if (((this->backend).supports_empty_struct & 1U) == 0) {
          if (((this->backend).use_typed_initializer_list & 1U) == 0) {
            if (((this->backend).use_initializer_list & 1U) == 0) {
              ts_1_00 = (char (*) [4])0x0;
              (*(this->super_Compiler)._vptr_Compiler[0x13])(local_390,this,local_30);
              join<std::__cxx11::string,char_const(&)[4]>
                        (__return_storage_ptr__,local_390,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xf6058d,ts_1_00);
              ::std::__cxx11::string::~string((string *)local_390);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ 0 }",&local_369);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
            }
          }
          else {
            ts_1 = (char (*) [6])0x0;
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_368,this,local_30);
            join<std::__cxx11::string,char_const(&)[6]>
                      (__return_storage_ptr__,local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ 0 }",
                       ts_1);
            ::std::__cxx11::string::~string((string *)local_368);
          }
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"{ }",&local_341);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
        }
      }
      else {
        uVar3 = SPIRConstant::columns(pSStack_20);
        if (uVar3 == 1) {
          tmp_type_1.member_name_cache._M_h._M_single_bucket._7_1_ = 0;
          (*(this->super_Compiler)._vptr_Compiler[0x19])(__return_storage_ptr__,this,pSStack_20,0);
          if ((((type._6_1_ & 1) != 0) &&
              ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
             (local_30->basetype == Boolean)) {
            SPIRType::SPIRType((SPIRType *)local_4e8,local_30);
            tmp_type_1.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_528,this,local_4e8,0);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_508,local_528,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075
                       ,(char (*) [2])__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d
                       ,in_R9);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_508)
            ;
            ::std::__cxx11::string::~string((string *)&local_508);
            ::std::__cxx11::string::~string((string *)local_528);
            SPIRType::~SPIRType((SPIRType *)local_4e8);
          }
        }
        else {
          local_529 = 0;
          (*(this->super_Compiler)._vptr_Compiler[0x13])
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_550,
                     this,local_30,0);
          ::std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_550,"(");
          ::std::__cxx11::string::~string((string *)local_550);
          for (local_554 = 0; uVar4 = local_554, uVar3 = SPIRConstant::columns(pSStack_20),
              uVar4 < uVar3; local_554 = local_554 + 1) {
            uVar3 = SPIRConstant::specialization_constant_id(pSStack_20,local_554);
            if (uVar3 == 0) {
              (*(this->super_Compiler)._vptr_Compiler[0x19])
                        (&tmp_type_2.member_name_cache._M_h._M_single_bucket,this,pSStack_20,
                         (ulong)local_554);
              ::std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,
                         (string *)&tmp_type_2.member_name_cache._M_h._M_single_bucket);
              ::std::__cxx11::string::~string
                        ((string *)&tmp_type_2.member_name_cache._M_h._M_single_bucket);
            }
            else {
              uVar3 = SPIRConstant::specialization_constant_id(pSStack_20,local_554);
              (*(this->super_Compiler)._vptr_Compiler[6])(local_578,this,(ulong)uVar3,1);
              ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_578);
              ::std::__cxx11::string::~string(local_578);
            }
            uVar4 = local_554 + 1;
            uVar3 = SPIRConstant::columns(pSStack_20);
            if (uVar4 < uVar3) {
              ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
            }
          }
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
          if ((((type._6_1_ & 1) != 0) &&
              ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
             (local_30->basetype == Boolean)) {
            SPIRType::SPIRType((SPIRType *)local_6e8,local_30);
            tmp_type_2.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
            (*(this->super_Compiler)._vptr_Compiler[0x13])(local_728,this,local_6e8,0);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_708,local_728,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe5b075
                       ,(char (*) [2])__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf65f2d
                       ,in_R9);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_708)
            ;
            ::std::__cxx11::string::~string((string *)&local_708);
            ::std::__cxx11::string::~string((string *)local_728);
            SPIRType::~SPIRType((SPIRType *)local_6e8);
          }
        }
      }
    }
    else {
      local_65 = 0;
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_749 = 0;
      if ((type._7_1_ & 1) != 0) {
        bVar2 = Compiler::is_array(&this->super_Compiler,local_30);
        local_749 = 0;
        if (bVar2) {
          local_749 = (this->backend).array_is_value_type_in_buffer_blocks ^ 0xff;
        }
      }
      local_66 = local_749 & 1;
      local_67 = 0;
      if (((((this->backend).use_initializer_list & 1U) == 0) ||
          (((this->backend).use_typed_initializer_list & 1U) == 0)) ||
         ((local_30->basetype != Struct ||
          (bVar2 = Compiler::is_array(&this->super_Compiler,local_30), bVar2)))) {
        if ((((((this->backend).use_initializer_list & 1U) == 0) ||
             (((this->backend).use_typed_initializer_list & 1U) == 0)) ||
            (((this->backend).array_is_value_type & 1U) == 0)) ||
           ((bVar2 = Compiler::is_array(&this->super_Compiler,local_30), !bVar2 ||
            ((local_66 & 1) != 0)))) {
          if (((this->backend).use_initializer_list & 1U) == 0) {
            type_to_glsl_constructor_abi_cxx11_((string *)local_280,this,local_30);
            ::std::operator+(&local_260,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_280,"(");
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_260)
            ;
            ::std::__cxx11::string::~string((string *)&local_260);
            ::std::__cxx11::string::~string((string *)local_280);
          }
          else {
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
          }
        }
        else {
          tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)local_30;
          SPIRType::SPIRType((SPIRType *)local_200,OpNop);
          if ((((type._6_1_ & 1) != 0) &&
              ((this->backend).boolean_in_struct_remapped_type != Boolean)) &&
             (local_30->basetype == Boolean)) {
            SPIRType::operator=((SPIRType *)local_200,local_30);
            tmp_type.super_IVariant.self.id = (this->backend).boolean_in_struct_remapped_type;
            tmp_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)local_200;
          }
          type_to_glsl_constructor_abi_cxx11_
                    (&local_240,this,(SPIRType *)tmp_type.member_name_cache._M_h._M_single_bucket);
          ::std::operator+(&local_220,&local_240,"({ ");
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_220);
          ::std::__cxx11::string::~string((string *)&local_220);
          ::std::__cxx11::string::~string((string *)&local_240);
          local_67 = 1;
          SPIRType::~SPIRType((SPIRType *)local_200);
        }
      }
      else {
        type_to_glsl_constructor_abi_cxx11_((string *)&p_type,this,local_30);
        ::std::operator+(&local_88,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p_type,"{ ");
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
        ::std::__cxx11::string::~string((string *)&local_88);
        ::std::__cxx11::string::~string((string *)&p_type);
      }
      __range4._4_4_ = 0;
      __begin4 = (TypedID<(diligent_spirv_cross::Types)3> *)&pSStack_20->subconstants;
      __end4 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>::begin
                         ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>
                           *)__begin4);
      elem = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>::end
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>
                         *)__begin4);
      for (; __end4 != elem; __end4 = __end4 + 1) {
        op = (SPIRConstantOp *)__end4;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end4);
        local_2b0 = Compiler::maybe_get<diligent_spirv_cross::SPIRConstantOp>
                              (&this->super_Compiler,uVar3);
        if (local_2b0 == (SPIRConstantOp *)0x0) {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
          pSVar5 = Compiler::maybe_get<diligent_spirv_cross::SPIRUndef>(&this->super_Compiler,uVar3)
          ;
          if (pSVar5 == (SPIRUndef *)0x0) {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
            local_2f8 = Compiler::get<diligent_spirv_cross::SPIRConstant>
                                  (&this->super_Compiler,uVar3);
            if ((local_2f8->specialization & 1U) != 0) {
              uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
              bVar2 = expression_is_forwarded(this,uVar3);
              if (!bVar2) {
                uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
                (*(this->super_Compiler)._vptr_Compiler[6])(local_318,this,(ulong)uVar3,1);
                ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_318);
                ::std::__cxx11::string::~string(local_318);
                goto LAB_00cd80c5;
              }
            }
            bVar2 = Compiler::is_array(&this->super_Compiler,local_30);
            if ((!bVar2) && (local_30->basetype == Struct)) {
              local_31c = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(local_30->super_IVariant).self);
              type._7_1_ = Compiler::has_member_decoration
                                     (&this->super_Compiler,(TypeID)local_31c,__range4._4_4_,
                                      DecorationOffset);
            }
            if (local_30->basetype == Struct) {
              type._6_1_ = 1;
            }
            constant_expression_abi_cxx11_
                      (&local_340,this,local_2f8,(bool)(type._7_1_ & 1),(bool)(type._6_1_ & 1));
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_340);
            ::std::__cxx11::string::~string((string *)&local_340);
          }
          else {
            uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)op);
            (*(this->super_Compiler)._vptr_Compiler[6])(&subc,this,(ulong)uVar3,1);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&subc);
            ::std::__cxx11::string::~string((string *)&subc);
          }
        }
        else {
          (*(this->super_Compiler)._vptr_Compiler[0x18])(local_2d0,this,local_2b0);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_2d0);
          ::std::__cxx11::string::~string(local_2d0);
        }
LAB_00cd80c5:
        pSVar1 = op;
        pSVar6 = (SPIRConstantOp *)
                 VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>::back
                           (&(pSStack_20->subconstants).
                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)3>_>
                           );
        if (pSVar1 != pSVar6) {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        __range4._4_4_ = __range4._4_4_ + 1;
      }
      pcVar8 = ")";
      if (((this->backend).use_initializer_list & 1U) != 0) {
        pcVar8 = " }";
      }
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar8);
      if ((local_67 & 1) != 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"GL_EXT_null_initializer",&local_51);
    require_extension_internal(this,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->backend).constant_null_initializer
              );
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_expression(const SPIRConstant &c,
                                         bool inside_block_like_struct_scope,
                                         bool inside_struct_scope)
{
	auto &type = get<SPIRType>(c.constant_type);

	if (is_pointer(type))
	{
		return backend.null_pointer_literal;
	}
	else if (c.is_null_array_specialized_length && backend.requires_matching_array_initializer)
	{
		require_extension_internal("GL_EXT_null_initializer");
		return backend.constant_null_initializer;
	}
	else if (!c.subconstants.empty())
	{
		// Handles Arrays and structures.
		string res;

		// Only consider the decay if we are inside a struct scope where we are emitting a member with Offset decoration.
		// Outside a block-like struct declaration, we can always bind to a constant array with templated type.
		// Should look at ArrayStride here as well, but it's possible to declare a constant struct
		// with Offset = 0, using no ArrayStride on the enclosed array type.
		// A particular CTS test hits this scenario.
		bool array_type_decays = inside_block_like_struct_scope &&
		                         is_array(type) &&
		                         !backend.array_is_value_type_in_buffer_blocks;

		// Allow Metal to use the array<T> template to make arrays a value type
		bool needs_trailing_tracket = false;
		if (backend.use_initializer_list && backend.use_typed_initializer_list && type.basetype == SPIRType::Struct &&
		    !is_array(type))
		{
			res = type_to_glsl_constructor(type) + "{ ";
		}
		else if (backend.use_initializer_list && backend.use_typed_initializer_list && backend.array_is_value_type &&
		         is_array(type) && !array_type_decays)
		{
			const auto *p_type = &type;
			SPIRType tmp_type { OpNop };

			if (inside_struct_scope &&
			    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
			    type.basetype == SPIRType::Boolean)
			{
				tmp_type = type;
				tmp_type.basetype = backend.boolean_in_struct_remapped_type;
				p_type = &tmp_type;
			}

			res = type_to_glsl_constructor(*p_type) + "({ ";
			needs_trailing_tracket = true;
		}
		else if (backend.use_initializer_list)
		{
			res = "{ ";
		}
		else
		{
			res = type_to_glsl_constructor(type) + "(";
		}

		uint32_t subconstant_index = 0;
		for (auto &elem : c.subconstants)
		{
			if (auto *op = maybe_get<SPIRConstantOp>(elem))
			{
				res += constant_op_expression(*op);
			}
			else if (maybe_get<SPIRUndef>(elem) != nullptr)
			{
				res += to_name(elem);
			}
			else
			{
				auto &subc = get<SPIRConstant>(elem);
				if (subc.specialization && !expression_is_forwarded(elem))
					res += to_name(elem);
				else
				{
					if (!is_array(type) && type.basetype == SPIRType::Struct)
					{
						// When we get down to emitting struct members, override the block-like information.
						// For constants, we can freely mix and match block-like state.
						inside_block_like_struct_scope =
						    has_member_decoration(type.self, subconstant_index, DecorationOffset);
					}

					if (type.basetype == SPIRType::Struct)
						inside_struct_scope = true;

					res += constant_expression(subc, inside_block_like_struct_scope, inside_struct_scope);
				}
			}

			if (&elem != &c.subconstants.back())
				res += ", ";

			subconstant_index++;
		}

		res += backend.use_initializer_list ? " }" : ")";
		if (needs_trailing_tracket)
			res += ")";

		return res;
	}
	else if (type.basetype == SPIRType::Struct && type.member_types.size() == 0)
	{
		// Metal tessellation likes empty structs which are then constant expressions.
		if (backend.supports_empty_struct)
			return "{ }";
		else if (backend.use_typed_initializer_list)
			return join(type_to_glsl(type), "{ 0 }");
		else if (backend.use_initializer_list)
			return "{ 0 }";
		else
			return join(type_to_glsl(type), "(0)");
	}
	else if (c.columns() == 1)
	{
		auto res = constant_expression_vector(c, 0);

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
	else
	{
		string res = type_to_glsl(type) + "(";
		for (uint32_t col = 0; col < c.columns(); col++)
		{
			if (c.specialization_constant_id(col) != 0)
				res += to_name(c.specialization_constant_id(col));
			else
				res += constant_expression_vector(c, col);

			if (col + 1 < c.columns())
				res += ", ";
		}
		res += ")";

		if (inside_struct_scope &&
		    backend.boolean_in_struct_remapped_type != SPIRType::Boolean &&
		    type.basetype == SPIRType::Boolean)
		{
			SPIRType tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			res = join(type_to_glsl(tmp_type), "(", res, ")");
		}

		return res;
	}
}